

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::_::HashSetCallbacks>::
find<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char_const>&>
          (HashIndex<kj::_::HashSetCallbacks> *this,
          ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> table,ArrayPtr<const_unsigned_char> *params)

{
  int iVar1;
  uchar *puVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar7;
  ArrayPtr<const_unsigned_char> *pAVar8;
  ArrayPtr<const_unsigned_char> *in_R8;
  ulong uVar9;
  Maybe<unsigned_long> MVar10;
  ulong uVar6;
  
  pAVar8 = table.ptr;
  if (pAVar8[1].size_ == 0) {
    *(undefined1 *)this = 0;
    aVar7.value = table.size_;
  }
  else {
    uVar4 = hashCode<kj::ArrayPtr<unsigned_char_const>&>(in_R8);
    uVar5 = _::chooseBucket((uint)(uVar4 != 0),(uint)pAVar8[1].size_);
    uVar6 = (ulong)uVar5;
    aVar7 = extraout_RDX;
    while( true ) {
      puVar2 = pAVar8[1].ptr;
      iVar1 = *(int *)(puVar2 + uVar6 * 8 + 4);
      if (iVar1 == 0) break;
      if (((iVar1 != 1) && (*(uint *)(puVar2 + uVar6 * 8) == (uint)(uVar4 != 0))) &&
         (bVar3 = ArrayPtr<const_unsigned_char>::operator==
                            ((ArrayPtr<const_unsigned_char> *)
                             ((ulong)(iVar1 - 2) * 0x10 + table.size_),in_R8),
         aVar7 = extraout_RDX_00, bVar3)) {
        iVar1 = *(int *)(puVar2 + uVar6 * 8 + 4);
        *(undefined1 *)this = 1;
        this->erasedCount = (ulong)(iVar1 - 2);
        goto LAB_002080eb;
      }
      uVar9 = uVar6 + 1;
      uVar6 = 0;
      if (uVar9 != pAVar8[1].size_) {
        uVar6 = uVar9 & 0xffffffff;
      }
    }
    *(undefined1 *)this = 0;
  }
LAB_002080eb:
  MVar10.ptr.field_1.value = aVar7.value;
  MVar10.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar10.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }